

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O2

int corpus_get_generic_featurevec(vector_t **mfc,int32 *n_frame,uint32 veclen)

{
  ulong n_elem;
  uint32 uVar1;
  uint32 uVar2;
  vector_t **pppfVar3;
  int32 *piVar4;
  int iVar5;
  vector_t *ppfVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  long ln;
  float32 **data_ref;
  int iVar10;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar11;
  uint32 n_c;
  float32 *coeff;
  vector_t **local_40;
  int32 *local_38;
  
  if (requires_mfcc != '\x01') {
    return -1;
  }
  if (mfc == (vector_t **)0x0) {
    coeff = (float32 *)0x0;
    data_ref = (float32 **)0x0;
  }
  else {
    data_ref = &coeff;
  }
  iVar10 = 0x65;
  local_40 = mfc;
  local_38 = n_frame;
  while( true ) {
    if ((cur_ctl_sf & cur_ctl_ef) == 0xffffffff) {
      mk_filename(1,cur_ctl_path);
      iVar5 = areadfloat(mk_filename::fn,(float **)data_ref,(int *)&n_c);
    }
    else {
      if ((cur_ctl_sf == 0xffffffff) || (cur_ctl_ef == 0xffffffff)) {
        pcVar7 = "Both start and end frame must be set in the ctl file\n";
        ln = 0x52d;
        goto LAB_00112ab7;
      }
      mk_filename(1,cur_ctl_path);
      iVar5 = areadfloat_part(mk_filename::fn,cur_ctl_sf * veclen,(cur_ctl_ef + 1) * veclen + -1,
                              (float **)data_ref,(int *)&n_c);
    }
    uVar2 = cur_ctl_ef;
    uVar1 = cur_ctl_sf;
    uVar11 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    if (iVar5 != -1) break;
    mk_filename(1,cur_ctl_path);
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                   ,0x532,"Failed to read MFC file \'%s\'. Retrying after sleep...\n",
                   mk_filename::fn);
    sleep(3);
    iVar10 = iVar10 + -1;
    if (iVar10 == 0) {
      pcVar7 = "Failed to get the files after 100 retries (about 300 seconds)\n";
      ln = 0x536;
LAB_00112ab7:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
              ,ln,pcVar7);
LAB_00112abe:
      exit(1);
    }
  }
  if ((cur_ctl_ef != 0xffffffff && cur_ctl_sf != 0xffffffff) && iVar5 == 0) {
    pcVar7 = corpus_utt();
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
            ,0x53d,"Region [%d %d] for %s extends beyond end of file\n",(ulong)uVar1,(ulong)uVar2,
            pcVar7);
    uVar11 = (undefined4)((ulong)pcVar7 >> 0x20);
  }
  piVar4 = local_38;
  pppfVar3 = local_40;
  n_elem = (ulong)n_c / (ulong)veclen;
  uVar8 = (ulong)n_c % (ulong)veclen;
  if ((int)uVar8 == 0) {
    if (n_c < veclen) {
      if (local_40 != (vector_t **)0x0) {
        *local_40 = (vector_t *)0x0;
      }
      if (local_38 != (int32 *)0x0) {
        *local_38 = 0;
      }
    }
    if ((local_40 != (vector_t **)0x0) && (coeff != (float32 *)0x0)) {
      ppfVar6 = (vector_t *)
                __ckd_calloc__(n_elem,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                               ,0x54e);
      uVar9 = 0;
      for (uVar8 = 0; uVar8 < n_elem; uVar8 = uVar8 + 1) {
        ppfVar6[uVar8] = (vector_t)(coeff + uVar9);
        uVar9 = uVar9 + veclen;
      }
      *pppfVar3 = ppfVar6;
    }
    if (piVar4 == (int32 *)0x0) {
      return 0;
    }
    *piVar4 = (int32)n_elem;
    return 0;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
          ,0x541,"Expected mfcc vector len of %d, got %d (%d)\n",(ulong)veclen,uVar8,
          CONCAT44(uVar11,n_c));
  goto LAB_00112abe;
}

Assistant:

int
corpus_get_generic_featurevec(vector_t **mfc,
			      int32 *n_frame,
			      uint32 veclen)
{
    vector_t *out;
    float32 *coeff, **cptr;
    uint32 n_f;
    uint32 n_c;
    uint32 i, j;
    uint32 ret=S3_ERROR;
    uint32 no_retries=0;

    if (!requires_mfcc) {
	/* asked for mfc data, but not set up to send it */
	return S3_ERROR;
    }

    if (mfc)
	cptr = &coeff;
    else {
	/* If mfc == NULL, just get the number of frames. */
	coeff = NULL;
	cptr = NULL;
    }

    do {
	if ((cur_ctl_sf == NO_FRAME) && (cur_ctl_ef == NO_FRAME)) {
	    ret = areadfloat(mk_filename(DATA_TYPE_MFCC, cur_ctl_path),
			     cptr, (int *)&n_c);
	}
	else if ((cur_ctl_sf != NO_FRAME) && (cur_ctl_ef != NO_FRAME)) {
	    ret = areadfloat_part(mk_filename(DATA_TYPE_MFCC, cur_ctl_path),
				  cur_ctl_sf * veclen,
				  (cur_ctl_ef + 1) * veclen - 1,
				  cptr, (int *)&n_c);
	}
	else {
	    E_FATAL("Both start and end frame must be set in the ctl file\n");
	}

	if (ret == S3_ERROR) {
	    E_ERROR_SYSTEM("Failed to read MFC file '%s'. Retrying after sleep...\n",
		    mk_filename(DATA_TYPE_MFCC, cur_ctl_path));
	    no_retries++;
	    sleep(3);
	    if(no_retries>100){ 
	      E_FATAL("Failed to get the files after 100 retries (about 300 seconds)\n");
	    }
	}
    } while (ret == S3_ERROR);

    if ((ret == 0) && (cur_ctl_sf != NO_FRAME) && (cur_ctl_ef != NO_FRAME)) {
	E_ERROR("Region [%d %d] for %s extends beyond end of file\n",
		cur_ctl_sf, cur_ctl_ef, corpus_utt());
    }

    if ((n_c % veclen) != 0) {
	E_FATAL("Expected mfcc vector len of %d, got %d (%d)\n", veclen, n_c % veclen, n_c);
    }
    
    n_f = n_c / veclen;

    if (n_f == 0) {
	if (mfc)
	    *mfc = NULL;
	if (n_frame)
	    *n_frame = 0;
    }

    if (mfc && coeff) {
	out = (vector_t *)ckd_calloc(n_f, sizeof(vector_t));

	for (i = 0, j = 0; i < n_f; i++, j += veclen) {
	    out[i] = &coeff[j];
	}

	*mfc = out;
    }
    if (n_frame)
	*n_frame = n_f;

    return S3_SUCCESS;
}